

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiID *pIVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImGuiShrinkWidthItem *pIVar6;
  char *__src;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  ImGuiID IVar11;
  ImGuiID IVar12;
  ImGuiID IVar13;
  ImGuiID IVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  int section_n;
  ImGuiTabItem *pIVar20;
  ImGuiTabItem *pIVar21;
  ImGuiShrinkWidthItem *__dest;
  ulong uVar22;
  char *__dest_00;
  long lVar23;
  uint uVar24;
  float *pfVar25;
  byte bVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  uint uVar30;
  ulong uVar31;
  float *pfVar32;
  long lVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  ImVec2 IVar37;
  undefined1 auVar38 [16];
  undefined1 auVar41 [16];
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  float fVar48;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  float local_114;
  float local_fc [4];
  uint uStack_ec;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined1 local_c8 [16];
  int local_ac [3];
  ImVec2 local_a0;
  undefined1 local_98 [16];
  ImVec4 local_88;
  undefined8 local_78;
  ulong local_70;
  undefined1 local_68 [16];
  ImVec4 local_58;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  
  pIVar16 = GImGui;
  tab_bar->WantLayout = false;
  local_e8 = 0;
  uStack_e0 = 0;
  local_fc[1] = 0.0;
  local_fc[2] = 0.0;
  stack0xffffffffffffff10 = 0;
  local_d8 = 0;
  iVar27 = (tab_bar->Tabs).Size;
  if (iVar27 < 1) {
    bVar26 = 0;
    iVar28 = 0;
  }
  else {
    pIVar20 = (tab_bar->Tabs).Data;
    lVar23 = 0;
    uVar31 = 0;
    uVar22 = 0;
    bVar26 = 0;
    do {
      pIVar1 = (ImGuiID *)((long)&pIVar20->ID + lVar23);
      if ((*(int *)((long)&pIVar20->LastFrameVisible + lVar23) < tab_bar->PrevFrameVisible) ||
         ((&pIVar20->WantClose)[lVar23] == true)) {
        IVar4 = *pIVar1;
        if (tab_bar->VisibleTabId == IVar4) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == IVar4) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == IVar4) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        iVar27 = (int)uVar22;
        if (uVar31 != uVar22) {
          *(undefined4 *)((long)&pIVar20[iVar27].BeginOrder + 1) =
               *(undefined4 *)((long)pIVar1 + 0x1f);
          IVar11 = pIVar1[0];
          IVar12 = pIVar1[1];
          IVar13 = pIVar1[2];
          IVar14 = pIVar1[3];
          fVar43 = (float)pIVar1[5];
          fVar46 = (float)pIVar1[6];
          IVar4 = pIVar1[7];
          pfVar25 = &pIVar20[iVar27].Offset;
          *pfVar25 = (float)pIVar1[4];
          pfVar25[1] = fVar43;
          pfVar25[2] = fVar46;
          pfVar25[3] = (float)IVar4;
          pIVar20 = pIVar20 + iVar27;
          pIVar20->ID = IVar11;
          pIVar20->Flags = IVar12;
          pIVar20->LastFrameVisible = IVar13;
          pIVar20->LastFrameSelected = IVar14;
          pIVar20 = (tab_bar->Tabs).Data;
        }
        pIVar20[iVar27].IndexDuringLayout = (ImS16)uVar22;
        uVar34 = pIVar20[iVar27].Flags;
        lVar33 = 0;
        if ((uVar34 & 0x40) == 0) {
          lVar33 = (ulong)((char)(byte)uVar34 < '\0') + 1;
        }
        if (0 < iVar27) {
          bVar26 = (pIVar20[uVar22 - 1].Flags & 0x40U) == 0 & (byte)uVar34 >> 6 | bVar26 |
                   ((uVar34 & 0xc0) != 0x80 && (pIVar20[uVar22 - 1].Flags & 0xc0U) == 0x80);
        }
        local_fc[lVar33 * 3 + 1] = (float)((int)local_fc[lVar33 * 3 + 1] + 1);
        uVar22 = (ulong)(iVar27 + 1);
        iVar27 = (tab_bar->Tabs).Size;
      }
      iVar28 = (int)uVar22;
      uVar31 = uVar31 + 1;
      lVar23 = lVar23 + 0x24;
    } while ((long)uVar31 < (long)iVar27);
  }
  if (iVar27 != iVar28) {
    iVar27 = (tab_bar->Tabs).Capacity;
    if (iVar27 < iVar28) {
      if (iVar27 == 0) {
        iVar27 = 8;
      }
      else {
        iVar27 = iVar27 / 2 + iVar27;
      }
      if (iVar27 <= iVar28) {
        iVar27 = iVar28;
      }
      pIVar21 = (ImGuiTabItem *)MemAlloc((long)iVar27 * 0x24);
      pIVar20 = (tab_bar->Tabs).Data;
      if (pIVar20 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar21,pIVar20,(long)(tab_bar->Tabs).Size * 0x24);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar21;
      (tab_bar->Tabs).Capacity = iVar27;
    }
    (tab_bar->Tabs).Size = iVar28;
  }
  if (bVar26 != 0) {
    qsort((tab_bar->Tabs).Data,(long)iVar28,0x24,TabItemComparerBySection);
  }
  fVar43 = local_fc[1];
  iVar27 = (int)uStack_e0;
  uVar22 = uStack_e0 & 0xffffffff;
  local_fc[0] = 0.0;
  local_114 = 0.0;
  if (0 < (int)((int)uStack_e0 + uStack_ec) && 0 < (int)local_fc[1]) {
    local_fc[0] = (pIVar16->Style).ItemInnerSpacing.x;
  }
  stack0xffffffffffffff10 = CONCAT44(uStack_ec,local_fc[0]);
  local_70 = (ulong)uStack_ec;
  if (0 < (int)uStack_e0 && 0 < (int)uStack_ec) {
    local_114 = (pIVar16->Style).ItemInnerSpacing.x;
  }
  local_e8 = CONCAT44(local_114,(float)local_e8);
  fVar46 = (float)tab_bar->NextSelectedTabId;
  if (fVar46 != 0.0) {
    tab_bar->SelectedTabId = (ImGuiID)fVar46;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    bVar17 = TabBarProcessReorder(tab_bar);
    if ((bVar17) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      fVar46 = (float)tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar15 = GImGui;
  if ((tab_bar->Flags & 4) != 0) {
    local_c8._0_8_ = uVar22;
    pIVar5 = GImGui->CurrentWindow;
    fVar35 = (GImGui->Style).FramePadding.y;
    fVar42 = GImGui->FontSize;
    IVar37 = (pIVar5->DC).CursorPos;
    fVar36 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar35;
    (pIVar5->DC).CursorPos.y = fVar36;
    (tab_bar->BarRect).Min.x = fVar42 + fVar35 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar15->Style).Colors[0].x;
    local_58.y = (pIVar15->Style).Colors[0].y;
    uVar7 = (pIVar15->Style).Colors[0].z;
    uVar8 = (pIVar15->Style).Colors[0].w;
    local_58.w = (float)uVar8 * 0.5;
    local_58.z = (float)uVar7;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    bVar17 = BeginCombo("##v",(char *)0x0,0x50);
    PopStyleColor(2);
    if (bVar17) {
      iVar27 = (tab_bar->Tabs).Size;
      if (0 < iVar27) {
        lVar33 = 0;
        lVar23 = 0;
        pfVar25 = (float *)0x0;
        do {
          pIVar20 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar20->Flags + lVar33 + 2) & 0x20) == 0) {
            local_88.x = 0.0;
            local_88.y = 0.0;
            bVar17 = Selectable((tab_bar->TabsNames).Buf.Data +
                                *(short *)((long)&pIVar20->NameOffset + lVar33),
                                tab_bar->SelectedTabId == *(ImGuiID *)((long)&pIVar20->ID + lVar33),
                                0,(ImVec2 *)&local_88);
            if (bVar17) {
              pfVar25 = (float *)((long)&pIVar20->ID + lVar33);
            }
            iVar27 = (tab_bar->Tabs).Size;
          }
          lVar23 = lVar23 + 1;
          lVar33 = lVar33 + 0x24;
        } while (lVar23 < iVar27);
        EndPopup();
        (pIVar5->DC).CursorPos = IVar37;
        iVar27 = local_c8._0_4_;
        if (pfVar25 != (float *)0x0) {
          fVar46 = *pfVar25;
          tab_bar->SelectedTabId = (ImGuiID)fVar46;
        }
        goto LAB_00166251;
      }
      EndPopup();
      (pIVar5->DC).CursorPos = IVar37;
    }
    else {
      (pIVar5->DC).CursorPos = IVar37;
    }
    iVar27 = local_c8._0_4_;
  }
LAB_00166251:
  local_ac[0] = 0;
  local_ac[1] = iVar27 + (int)fVar43;
  local_ac[2] = (int)fVar43;
  iVar27 = (tab_bar->Tabs).Size;
  iVar28 = (pIVar16->ShrinkWidthBuffer).Capacity;
  iVar29 = iVar27;
  if (iVar28 < iVar27) {
    if (iVar28 == 0) {
      iVar28 = 8;
    }
    else {
      iVar28 = iVar28 / 2 + iVar28;
    }
    if (iVar28 <= iVar27) {
      iVar28 = iVar27;
    }
    __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar28 << 3);
    pIVar6 = (pIVar16->ShrinkWidthBuffer).Data;
    if (pIVar6 != (ImGuiShrinkWidthItem *)0x0) {
      memcpy(__dest,pIVar6,(long)(pIVar16->ShrinkWidthBuffer).Size << 3);
      MemFree((pIVar16->ShrinkWidthBuffer).Data);
    }
    (pIVar16->ShrinkWidthBuffer).Data = __dest;
    (pIVar16->ShrinkWidthBuffer).Capacity = iVar28;
    iVar29 = (tab_bar->Tabs).Size;
  }
  (pIVar16->ShrinkWidthBuffer).Size = iVar27;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_c8._8_8_;
  local_c8 = auVar45 << 0x40;
  if (iVar29 < 1) {
    bVar17 = true;
    pfVar25 = (float *)0x0;
  }
  else {
    lVar23 = 0;
    lVar33 = 0;
    pfVar25 = (float *)0x0;
    bVar17 = false;
    iVar27 = -1;
    do {
      pIVar20 = (tab_bar->Tabs).Data;
      pfVar32 = (float *)((long)&pIVar20->ID + lVar23);
      if (((pfVar25 == (float *)0x0) ||
          ((int)pfVar25[3] < *(int *)((long)&pIVar20->LastFrameSelected + lVar23))) &&
         ((*(byte *)((long)&pIVar20->Flags + lVar23 + 2) & 0x20) == 0)) {
        pfVar25 = pfVar32;
      }
      fVar35 = *pfVar32;
      if (fVar35 == (float)tab_bar->SelectedTabId) {
        bVar17 = true;
      }
      if ((fVar46 == 0.0) && (fVar46 = fVar35, (float)pIVar16->NavJustMovedToId != fVar35)) {
        fVar46 = 0.0;
      }
      IVar37 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data +
                               *(short *)((long)&pIVar20->NameOffset + lVar23),
                               (*(uint *)((long)&pIVar20->Flags + lVar23) >> 0x14 & 1) == 0);
      auVar45 = local_c8;
      fVar35 = IVar37.x;
      *(float *)((long)&pIVar20->ContentWidth + lVar23) = fVar35;
      uVar34 = *(uint *)((long)&pIVar20->Flags + lVar23);
      uVar22 = (ulong)(((char)uVar34 < '\0') + 1);
      if ((uVar34 & 0x40) != 0) {
        uVar22 = 0;
      }
      fVar42 = 0.0;
      if ((int)uVar22 == iVar27) {
        fVar42 = (pIVar16->Style).ItemInnerSpacing.x;
      }
      local_fc[uVar22 * 3 + 2] = fVar42 + fVar35 + local_fc[uVar22 * 3 + 2];
      iVar27 = local_ac[uVar22];
      local_ac[uVar22] = iVar27 + 1;
      pIVar6 = (pIVar16->ShrinkWidthBuffer).Data;
      pIVar6[iVar27].Index = (int)lVar33;
      pIVar6[iVar27].Width = fVar35;
      *(float *)((long)&pIVar20->Width + lVar23) = fVar35;
      lVar33 = lVar33 + 1;
      iVar28 = (tab_bar->Tabs).Size;
      lVar23 = lVar23 + 0x24;
      iVar27 = (int)uVar22;
    } while (lVar33 < iVar28);
    local_c8._1_7_ = 0;
    local_c8[0] = 1 < iVar28;
    local_c8._8_8_ = auVar45._8_8_;
    bVar17 = !bVar17;
  }
  fVar35 = 0.0;
  lVar23 = 8;
  do {
    fVar35 = fVar35 + *(float *)((long)local_fc + lVar23) + *(float *)((long)local_fc + lVar23 + 4);
    lVar23 = lVar23 + 0xc;
  } while (lVar23 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar35;
  pIVar15 = GImGui;
  fVar42 = (tab_bar->BarRect).Max.x;
  if (((local_c8[0] & fVar42 - (tab_bar->BarRect).Min.x < fVar35) != 0) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar5 = GImGui->CurrentWindow;
    fVar42 = GImGui->FontSize + -2.0;
    local_68 = ZEXT416((uint)fVar42);
    fVar35 = (GImGui->Style).FramePadding.y;
    local_98 = ZEXT416((uint)(fVar35 + fVar35 + GImGui->FontSize));
    local_c8 = ZEXT416((uint)(fVar42 + fVar42));
    local_a0 = (pIVar5->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar9 = (GImGui->Style).Colors[0].z;
    uVar10 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar10 * 0.5;
    local_58.z = (float)uVar9;
    PushStyleColor(0,&local_58);
    local_88.x = 0.0;
    local_88.y = 0.0;
    local_88.z = 0.0;
    local_88.w = 0.0;
    PushStyleColor(0x15,&local_88);
    local_78._0_4_ = (pIVar15->IO).KeyRepeatDelay;
    local_78._4_4_ = (pIVar15->IO).KeyRepeatRate;
    (pIVar15->IO).KeyRepeatDelay = 0.25;
    (pIVar15->IO).KeyRepeatRate = 0.2;
    fVar35 = (tab_bar->BarRect).Min.x;
    fVar42 = (tab_bar->BarRect).Max.x - (float)local_c8._0_4_;
    uVar34 = -(uint)(fVar42 <= fVar35);
    local_48 = (float)(uVar34 & (uint)fVar35 | ~uVar34 & (uint)fVar42);
    uStack_44 = 0;
    uStack_40 = 0;
    uStack_3c = 0;
    fVar35 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = local_48;
    (pIVar5->DC).CursorPos.y = fVar35;
    auVar39._0_8_ = local_68._0_8_;
    auVar39._12_4_ = local_68._12_4_;
    auVar39._8_4_ = local_68._4_4_;
    auVar38._8_8_ = auVar39._8_8_;
    IVar37.x = local_68._0_4_;
    IVar37.y = (float)local_98._0_4_;
    auVar38._0_4_ = IVar37.x;
    auVar38._4_4_ = local_98._0_4_;
    auVar40._0_12_ = auVar38._0_12_;
    auVar40._12_4_ = local_98._4_4_;
    local_98 = auVar40;
    bVar18 = ArrowButtonEx("##<",0,IVar37,0x410);
    fVar35 = (tab_bar->BarRect).Min.y;
    (pIVar5->DC).CursorPos.x = local_48 + (float)local_68._0_4_;
    (pIVar5->DC).CursorPos.y = fVar35;
    bVar19 = ArrowButtonEx("##>",1,(ImVec2)local_98._0_8_,0x410);
    iVar27 = -(uint)bVar18;
    if (bVar19) {
      iVar27 = 1;
    }
    PopStyleColor(2);
    (pIVar15->IO).KeyRepeatDelay = (float)(undefined4)local_78;
    (pIVar15->IO).KeyRepeatRate = (float)local_78._4_4_;
    if ((iVar27 != 0) && (tab_bar->SelectedTabId != 0)) {
      uVar34 = (tab_bar->Tabs).Size;
      if (0 < (int)uVar34) {
        pIVar20 = (tab_bar->Tabs).Data;
        uVar22 = 0;
        pIVar21 = pIVar20;
        do {
          if (pIVar21->ID == tab_bar->SelectedTabId) goto LAB_00166964;
          uVar22 = uVar22 + 1;
          pIVar21 = pIVar21 + 1;
        } while (uVar34 != uVar22);
      }
    }
    (pIVar5->DC).CursorPos = local_a0;
    fVar42 = (tab_bar->BarRect).Max.x - ((float)local_c8._0_4_ + 1.0);
    (tab_bar->BarRect).Max.x = fVar42;
  }
LAB_001666d9:
  fVar35 = local_fc[2] + local_fc[0] + uStack_e0._4_4_ + 0.0;
  fVar42 = fVar42 - (tab_bar->BarRect).Min.x;
  if (fVar35 < fVar42) {
    fVar36 = ((float)local_e8 + local_114) -
             ((fVar42 - (local_fc[2] + local_fc[0])) - (uStack_e0._4_4_ + 0.0));
    if (0.0 <= fVar36) goto LAB_0016672f;
  }
  else {
    fVar36 = fVar35 - fVar42;
LAB_0016672f:
    if ((0.0 < fVar36) && ((fVar42 <= fVar35 || ((tab_bar->Flags & 0x40U) != 0)))) {
      iVar27 = (int)local_70;
      if (fVar42 <= fVar35) {
        iVar27 = (int)uStack_e0 + (int)fVar43;
      }
      iVar28 = 0;
      if (fVar35 < fVar42) {
        iVar28 = (int)uStack_e0 + (int)fVar43;
      }
      lVar23 = (long)iVar28;
      ShrinkWidths((pIVar16->ShrinkWidthBuffer).Data + lVar23,iVar27,fVar36);
      if (0 < iVar27) {
        pIVar6 = (pIVar16->ShrinkWidthBuffer).Data;
        do {
          iVar29 = (int)pIVar6[lVar23].Width;
          if (-1 < iVar29) {
            fVar35 = (float)iVar29;
            pIVar20 = (tab_bar->Tabs).Data;
            iVar29 = pIVar6[lVar23].Index;
            lVar33 = (ulong)((char)pIVar20[iVar29].Flags < '\0') + 1;
            if ((pIVar20[iVar29].Flags & 0x40U) != 0) {
              lVar33 = 0;
            }
            local_fc[lVar33 * 3 + 2] = local_fc[lVar33 * 3 + 2] - (pIVar20[iVar29].Width - fVar35);
            pIVar20[iVar29].Width = fVar35;
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 < iVar28 + iVar27);
      }
    }
  }
  lVar23 = 0;
  fVar42 = 0.0;
  iVar27 = 0;
  fVar35 = 0.0;
  do {
    fVar36 = fVar42;
    if ((lVar23 == 2) &&
       (fVar36 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_fc[8],
       fVar36 = (float)(~-(uint)(fVar36 <= 0.0) & (uint)fVar36), fVar42 <= fVar36)) {
      fVar36 = fVar42;
    }
    fVar47 = local_fc[lVar23 * 3 + 1];
    if (0 < (long)(int)fVar47) {
      pfVar32 = &(tab_bar->Tabs).Data[iVar27].Width;
      uVar22 = 0;
      do {
        pfVar32[-1] = fVar36;
        fVar42 = 0.0;
        if (uVar22 < (int)fVar47 - 1) {
          fVar42 = (pIVar16->Style).ItemInnerSpacing.x;
        }
        fVar36 = fVar36 + fVar42 + *pfVar32;
        uVar22 = uVar22 + 1;
        pfVar32 = pfVar32 + 9;
      } while ((long)(int)fVar47 != uVar22);
    }
    fVar42 = local_fc[lVar23 * 3 + 2] + local_fc[lVar23 * 3 + 3];
    fVar35 = fVar35 + (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
    fVar42 = fVar36 + local_fc[lVar23 * 3 + 3];
    iVar27 = (int)fVar47 + iVar27;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  tab_bar->WidthAllTabs = fVar35;
  if (bVar17) {
    tab_bar->SelectedTabId = 0;
  }
  else {
    fVar42 = (float)tab_bar->SelectedTabId;
    if (fVar42 != 0.0) goto LAB_0016691d;
  }
  fVar42 = 0.0;
  if ((tab_bar->NextSelectedTabId == 0) && (fVar42 = 0.0, pfVar25 != (float *)0x0)) {
    fVar46 = *pfVar25;
    tab_bar->SelectedTabId = (ImGuiID)fVar46;
    fVar42 = fVar46;
  }
LAB_0016691d:
  tab_bar->VisibleTabId = (ImGuiID)fVar42;
  tab_bar->VisibleTabWasSubmitted = false;
  if (fVar46 != 0.0) {
    iVar27 = (tab_bar->Tabs).Size;
    if (0 < (long)iVar27) {
      pfVar25 = &((tab_bar->Tabs).Data)->Width;
      lVar23 = 0;
      do {
        if ((float)((ImGuiTabItem *)(pfVar25 + -5))->ID == fVar46) {
          if (((uint)pfVar25[-4] & 0xc0) != 0) break;
          fVar46 = GImGui->FontSize;
          fVar42 = (tab_bar->BarRect).Max.x;
          fVar36 = (tab_bar->BarRect).Min.x;
          fVar47 = fVar46;
          if ((int)lVar23 < (int)fVar43) {
            fVar47 = -0.0;
          }
          fVar47 = (pfVar25[-1] - local_fc[2]) - fVar47;
          if (iVar27 - (int)uStack_e0 <= (int)lVar23 + 1) {
            fVar46 = 1.0;
          }
          fVar46 = (pfVar25[-1] - local_fc[2]) + *pfVar25 + fVar46;
          tab_bar->ScrollingTargetDistToVisibility = 0.0;
          if ((fVar47 < tab_bar->ScrollingTarget) ||
             (fVar43 = (((fVar42 - fVar36) - local_fc[2]) - uStack_e0._4_4_) - local_114,
             fVar43 <= fVar46 - fVar47)) {
            fVar42 = tab_bar->ScrollingAnim - fVar46;
          }
          else {
            if (fVar46 - fVar43 <= tab_bar->ScrollingTarget) break;
            fVar42 = (fVar47 - fVar43) - tab_bar->ScrollingAnim;
            fVar47 = fVar46 - fVar43;
          }
          tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar42) & (uint)fVar42);
          tab_bar->ScrollingTarget = fVar47;
          break;
        }
        lVar23 = lVar23 + 1;
        pfVar25 = pfVar25 + 9;
      } while (iVar27 != lVar23);
    }
  }
  fVar43 = (tab_bar->BarRect).Min.x;
  fVar46 = (tab_bar->BarRect).Max.x;
  auVar41._0_4_ = fVar35 - (fVar46 - fVar43);
  uVar2 = tab_bar->ScrollingAnim;
  uVar3 = tab_bar->ScrollingTarget;
  auVar44._4_4_ = uVar3;
  auVar44._0_4_ = uVar2;
  auVar44._8_8_ = 0;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar45 = minps(auVar44,auVar41);
  fVar35 = (float)(-(uint)(0.0 <= auVar45._0_4_) & (uint)auVar45._0_4_);
  fVar42 = (float)(-(uint)(0.0 <= auVar45._4_4_) & (uint)auVar45._4_4_);
  tab_bar->ScrollingAnim = fVar35;
  tab_bar->ScrollingTarget = fVar42;
  if ((fVar35 != fVar42) || (NAN(fVar35) || NAN(fVar42))) {
    fVar36 = pIVar16->FontSize;
    fVar47 = fVar36 * 70.0;
    uVar34 = -(uint)(fVar47 <= tab_bar->ScrollingSpeed);
    fVar48 = ABS(fVar42 - fVar35) / 0.3;
    fVar47 = (float)(~uVar34 & (uint)fVar47 | (uint)tab_bar->ScrollingSpeed & uVar34);
    uVar34 = -(uint)(fVar48 <= fVar47);
    fVar48 = (float)(~uVar34 & (uint)fVar48 | uVar34 & (uint)fVar47);
    tab_bar->ScrollingSpeed = fVar48;
    fVar47 = fVar42;
    if ((pIVar16->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= fVar36 * 10.0)) {
      fVar48 = fVar48 * (pIVar16->IO).DeltaTime;
      if (fVar42 <= fVar35) {
        fVar47 = fVar35;
        if (fVar42 < fVar35) {
          fVar35 = fVar35 - fVar48;
          uVar34 = -(uint)(fVar42 <= fVar35);
          fVar47 = (float)((uint)fVar35 & uVar34 | ~uVar34 & (uint)fVar42);
        }
      }
      else {
        fVar47 = fVar35 + fVar48;
        if (fVar42 <= fVar47) {
          fVar47 = fVar42;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar47;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = local_fc[0] + fVar43 + local_fc[2];
  tab_bar->ScrollingRectMaxX = (fVar46 - uStack_e0._4_4_) - local_114;
  if ((tab_bar->Flags & 0x100000) == 0) {
    if ((tab_bar->TabsNames).Buf.Capacity < 0) {
      __dest_00 = (char *)MemAlloc(0);
      __src = (tab_bar->TabsNames).Buf.Data;
      if (__src != (char *)0x0) {
        memcpy(__dest_00,__src,(long)(tab_bar->TabsNames).Buf.Size);
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = 0;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  (pIVar16->CurrentWindow->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabsIdeal;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  return;
LAB_00166964:
  do {
    uVar30 = (uint)uVar22;
    uVar24 = uVar30 + iVar27;
    uVar22 = (ulong)uVar24;
    if (uVar24 < uVar34) {
      uVar30 = uVar24;
    }
  } while (((pIVar20[(int)uVar30].Flags & 0x200000) != 0) && (uVar24 + iVar27 < uVar34));
  (pIVar5->DC).CursorPos = local_a0;
  fVar42 = (tab_bar->BarRect).Max.x - ((float)local_c8._0_4_ + 1.0);
  (tab_bar->BarRect).Max.x = fVar42;
  fVar46 = (float)pIVar20[(int)uVar30].ID;
  if ((pIVar20[(int)uVar30].Flags & 0x200000) == 0) {
    tab_bar->SelectedTabId = (ImGuiID)fVar46;
  }
  goto LAB_001666d9;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = (prev_tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (prev_tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_track_selected_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_track_selected_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_track_selected_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_track_selected_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_track_selected_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_track_selected_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) ? false : true;
        tab->ContentWidth = TabItemCalcSize(tab_name, has_close_button).x;

        int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        int shrink_buffer_index = shrink_buffer_indexes[section_n]++;
        g.ShrinkWidthBuffer[shrink_buffer_index].Index = tab_n;
        g.ShrinkWidthBuffer[shrink_buffer_index].Width = tab->ContentWidth;

        IM_ASSERT(tab->ContentWidth > 0.0f);
        tab->Width = tab->ContentWidth;
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_track_selected_tab_id = scroll_track_selected_tab->ID;
            if (!(scroll_track_selected_tab->Flags & ImGuiTabItemFlags_Button))
                tab_bar->SelectedTabId = scroll_track_selected_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess > 0.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            int section_n = (tab->Flags & ImGuiTabItemFlags_Leading) ? 0 : (tab->Flags & ImGuiTabItemFlags_Trailing) ? 2 : 1;
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_track_selected_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_track_selected_tab_id)
        if (ImGuiTabItem* scroll_track_selected_tab = TabBarFindTabByID(tab_bar, scroll_track_selected_tab_id))
            TabBarScrollToTab(tab_bar, scroll_track_selected_tab, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabsIdeal, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
}